

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::SharedDtor(NeuralNetworkClassifier *this)

{
  bool bVar1;
  string *default_value;
  NeuralNetworkClassifier *pNVar2;
  NeuralNetworkClassifier *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->labelprobabilitylayername_,default_value);
  pNVar2 = internal_default_instance();
  if ((this != pNVar2) && (this->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    (*(this->updateparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  bVar1 = has_ClassLabels(this);
  if (bVar1) {
    clear_ClassLabels(this);
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::SharedDtor() {
  labelprobabilitylayername_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete updateparams_;
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}